

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int bmcg_sat_solver_quantify
              (bmcg_sat_solver **pSats,Gia_Man_t *p,int iLit,int fHash,
              _func_int_void_ptr_int *pFuncCiToKeep,void *pData,Vec_Int_t *vDLits)

{
  void *pvVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pObj_00;
  int local_d0;
  Gia_Obj_t *pObj;
  int local_70;
  int Result;
  int Count;
  int RetValue;
  int Lit;
  int iVarLast;
  int iVar;
  int i;
  Vec_Str_t *vSop;
  Vec_Int_t *vVarMap;
  Vec_Int_t *vCiVars;
  Vec_Int_t *vObjsUsed;
  void *pData_local;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  int fHash_local;
  int iLit_local;
  Gia_Man_t *p_local;
  bmcg_sat_solver **pSats_local;
  
  vObjsUsed = (Vec_Int_t *)pData;
  pData_local = pFuncCiToKeep;
  pFuncCiToKeep_local._0_4_ = fHash;
  pFuncCiToKeep_local._4_4_ = iLit;
  _fHash_local = p;
  p_local = (Gia_Man_t *)pSats;
  vCiVars = Vec_IntAlloc(100);
  vVarMap = Vec_IntAlloc(100);
  vSop = (Vec_Str_t *)0x0;
  _iVar = (Vec_Str_t *)0x0;
  local_70 = 0;
  if (vDLits != (Vec_Int_t *)0x0) {
    Vec_IntClear(vDLits);
  }
  if (pFuncCiToKeep_local._4_4_ < 2) {
    pSats_local._4_4_ = pFuncCiToKeep_local._4_4_;
  }
  else {
    iVar3 = Vec_IntSize(&_fHash_local->vCopies);
    iVar4 = Gia_ManObjNum(_fHash_local);
    if (iVar3 < iVar4) {
      pVVar5 = &_fHash_local->vCopies;
      iVar3 = Gia_ManObjNum(_fHash_local);
      Vec_IntFillExtra(pVVar5,iVar3,-1);
    }
    Lit = Vec_IntSize(vCiVars);
    Vec_IntPush(vCiVars,0);
    Gia_ObjSetCopyArray(_fHash_local,0,Lit);
    pGVar2 = _fHash_local;
    if (Lit != 0) {
      __assert_fail("iVar == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                    ,0x448,
                    "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                   );
    }
    iVar3 = Abc_Lit2Var(pFuncCiToKeep_local._4_4_);
    RetValue = Gia_ManSatAndCollect_rec(pGVar2,iVar3,vCiVars,vVarMap);
    Gia_ManQuantLoadCnf(_fHash_local,vCiVars,&p_local->pName);
    iVar3 = RetValue;
    iVar4 = Abc_LitIsCompl(pFuncCiToKeep_local._4_4_);
    Count = Abc_Var2Lit(iVar3,(uint)((iVar4 != 0 ^ 0xffU) & 1));
    iVar3 = bmcg_sat_solver_addclause(p_local->pName,&Count,1);
    if ((iVar3 == 0) ||
       (iVar4 = bmcg_sat_solver_solve(p_local->pName,(int *)0x0,0), iVar3 = RetValue, iVar4 == -1))
    {
      pObj._4_4_ = 1;
    }
    else {
      iVar4 = Abc_LitIsCompl(pFuncCiToKeep_local._4_4_);
      Count = Abc_Var2Lit(iVar3,iVar4);
      iVar3 = bmcg_sat_solver_addclause(p_local->pSpec,&Count,1);
      if ((iVar3 == 0) || (iVar3 = bmcg_sat_solver_solve(p_local->pSpec,(int *)0x0,0), iVar3 == -1))
      {
        pObj._4_4_ = 0;
      }
      else {
        iVar3 = Vec_IntSize(vCiVars);
        vSop = (Vec_Str_t *)Vec_IntStartFull(iVar3);
        for (iVarLast = 0; iVar3 = iVarLast, iVar4 = Vec_IntSize(vVarMap), iVar3 < iVar4;
            iVarLast = iVarLast + 1) {
          Lit = Vec_IntEntry(vVarMap,iVarLast);
          pGVar2 = _fHash_local;
          iVar3 = Vec_IntEntry(vCiVars,Lit);
          pObj_00 = Gia_ManObj(pGVar2,iVar3);
          iVar3 = Gia_ObjIsCi(pObj_00);
          pvVar1 = pData_local;
          pVVar5 = vObjsUsed;
          if (iVar3 == 0) {
            __assert_fail("Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                          ,0x476,
                          "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                         );
          }
          iVar3 = Gia_ObjCioId(pObj_00);
          iVar3 = (*(code *)pvVar1)(pVVar5,iVar3);
          if (iVar3 != 0) {
            Vec_IntWriteEntry((Vec_Int_t *)vSop,Lit,iVarLast);
            local_70 = local_70 + 1;
          }
        }
        if ((local_70 == 0) || (iVar3 = Vec_IntSize(vVarMap), local_70 == iVar3)) {
          if (local_70 == 0) {
            local_d0 = 1;
          }
          else {
            local_d0 = pFuncCiToKeep_local._4_4_;
          }
          pObj._4_4_ = local_d0;
        }
        else {
          _iVar = Glucose_GenerateCubes(&p_local->pName,vVarMap,(Vec_Int_t *)vSop,0);
          for (iVarLast = 0; iVar3 = iVarLast, iVar4 = Vec_IntSize(vVarMap), iVar3 < iVar4;
              iVarLast = iVarLast + 1) {
            Lit = Vec_IntEntry(vVarMap,iVarLast);
            pVVar5 = vVarMap;
            iVar3 = iVarLast;
            iVar4 = Vec_IntEntry(vCiVars,Lit);
            Vec_IntWriteEntry(pVVar5,iVar3,iVar4);
          }
          if (vDLits != (Vec_Int_t *)0x0) {
            bmcg_sat_generate_dvars(vVarMap,_iVar,vDLits);
          }
          Gia_ManAndNum(_fHash_local);
          pObj._4_4_ = Gia_ManFactorSop(_fHash_local,vVarMap,_iVar,(int)pFuncCiToKeep_local);
        }
      }
    }
    for (iVarLast = 0; iVar3 = iVarLast, iVar4 = Vec_IntSize(vCiVars), iVar3 < iVar4;
        iVarLast = iVarLast + 1) {
      Lit = Vec_IntEntry(vCiVars,iVarLast);
      Gia_ObjSetCopyArray(_fHash_local,Lit,-1);
    }
    Vec_IntFree(vCiVars);
    Vec_IntFree(vVarMap);
    Vec_IntFreeP((Vec_Int_t **)&vSop);
    Vec_StrFreeP((Vec_Str_t **)&iVar);
    pSats_local._4_4_ = pObj._4_4_;
  }
  return pSats_local._4_4_;
}

Assistant:

int bmcg_sat_solver_quantify( bmcg_sat_solver * pSats[], Gia_Man_t * p, int iLit, int fHash, int(*pFuncCiToKeep)(void *, int), void * pData, Vec_Int_t * vDLits )
{
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); // GIA objs
    Vec_Int_t * vCiVars = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_Int_t * vVarMap = NULL; Vec_Str_t * vSop = NULL; 
    int i, iVar, iVarLast, Lit, RetValue, Count = 0, Result = -1;
    if ( vDLits ) Vec_IntClear( vDLits );
    if ( iLit < 2 )
        return iLit;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    // assign variable number 0 to const0 node
    iVar = Vec_IntSize(vObjsUsed); 
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );    

    // collect other variables
    iVarLast = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit), vObjsUsed, vCiVars );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );

    // check constants
    Lit = Abc_Var2Lit( iVarLast, !Abc_LitIsCompl(iLit) ); 
    RetValue = bmcg_sat_solver_addclause( pSats[0], &Lit, 1 ); // offset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[0], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 1;
        goto cleanup;
    }
    Lit = Abc_Var2Lit( iVarLast, Abc_LitIsCompl(iLit) );
    RetValue = bmcg_sat_solver_addclause( pSats[1], &Lit, 1 ); // onset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[1], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 0;
        goto cleanup;
    }
/*
    // reorder CI SAT variables to have keep-vars first
    Vec_Int_t * vCiVars2 = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( !pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    ABC_SWAP( Vec_Int_t *, vCiVars2, vCiVars );
    Vec_IntFree( vCiVars2 );
*/
    // map CI SAT variables into their indexes used in the cubes
    vVarMap = Vec_IntStartFull( Vec_IntSize(vObjsUsed) );
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntWriteEntry( vVarMap, iVar, i ), Count++;
    }
    if ( Count == 0 || Count == Vec_IntSize(vCiVars) )
    {
        Result = Count == 0 ? 1 : iLit;
        goto cleanup;
    }
    // generate cubes
    vSop = Glucose_GenerateCubes( pSats, vCiVars, vVarMap, 0 );
    //printf( "%s", Vec_StrArray(vSop) );
    // convert into object IDs
    Vec_IntForEachEntry( vCiVars, iVar, i )
        Vec_IntWriteEntry( vCiVars, i, Vec_IntEntry(vObjsUsed, iVar) );
    // generate unate variables
    if ( vDLits )
        bmcg_sat_generate_dvars( vCiVars, vSop, vDLits );
    // convert into an AIG
    RetValue = Gia_ManAndNum(p);
    Result = Gia_ManFactorSop( p, vCiVars, vSop, fHash );

    // report the result
//    printf( "Performed quantification with %5d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d cubes and %5d nodes. ", 
//        Vec_IntSize(vObjsUsed), Count, Vec_IntSize(vCiVars) - Count, Vec_StrCountEntry(vSop, '\n'), Gia_ManAndNum(p)-RetValue );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clkAll );

cleanup:
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );
    Vec_IntFree( vCiVars );
    Vec_IntFreeP( &vVarMap );
    Vec_StrFreeP( &vSop );
    return Result;
}